

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,wchar_t *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  int iVar2;
  FILE *data_;
  FILE *__stream;
  wchar_t *mode;
  bool local_51;
  undefined1 local_38 [8];
  auto_deleter<_IO_FILE> file;
  xml_encoding encoding_local;
  uint flags_local;
  char_t *indent_local;
  wchar_t *path__local;
  xml_document *this_local;
  
  mode = L"wb";
  if ((flags & 0x20) != 0) {
    mode = L"w";
  }
  file.deleter._0_4_ = encoding;
  file.deleter._4_4_ = flags;
  data_ = impl::anon_unknown_0::open_file_wide(path_,mode);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::auto_deleter
            ((auto_deleter<_IO_FILE> *)local_38,data_,impl::anon_unknown_0::close_file);
  bVar1 = impl::anon_unknown_0::save_file_impl
                    (this,(FILE *)local_38,indent,file.deleter._4_4_,(xml_encoding)file.deleter);
  local_51 = false;
  if (bVar1) {
    __stream = (FILE *)impl::anon_unknown_0::auto_deleter<_IO_FILE>::release
                                 ((auto_deleter<_IO_FILE> *)local_38);
    iVar2 = fclose(__stream);
    local_51 = iVar2 == 0;
  }
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter((auto_deleter<_IO_FILE> *)local_38);
  return local_51;
}

Assistant:

PUGI__FN bool xml_document::save_file(const wchar_t* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file_wide(path_, (flags & format_save_file_text) ? L"w" : L"wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding) && fclose(file.release()) == 0;
	}